

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# movegen.cpp
# Opt level: O1

idx puppup::movegen::__impl::orthogonal(idx step,idx cursor,Gaddag *gaddag,State *state)

{
  ulong uVar1;
  ulong uVar2;
  pointer pNVar3;
  long lVar4;
  long lVar5;
  idx iVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  
  uVar1 = cursor + step;
  if (((state->board)._M_elems[uVar1] == 0x1b) &&
     (*(long *)((long)state + (cursor - step) * 8 + 8) == 0x1b)) {
    iVar6 = 0;
  }
  else {
    lVar7 = *(long *)(board::letter_multiplier + cursor * 8) *
            (state->letter_score)._M_elems[cursor];
    pNVar3 = (gaddag->nodes_).
             super__Vector_base<puppup::trie::Gaddag::Node,_std::allocator<puppup::trie::Gaddag::Node>_>
             ._M_impl.super__Vector_impl_data._M_start;
    lVar5 = (pNVar3->children)._M_elems[(state->board)._M_elems[cursor]];
    if (uVar1 < 0xf1 && (uVar1 & 0x800000000000000f) != 0xf) {
      lVar9 = 0;
      lVar8 = 0;
      while ((*(long *)(board::word_multiplier + uVar1 * 8 + lVar9 * 8) != 0 &&
             (lVar10 = (state->board)._M_elems[uVar1 + lVar9], lVar10 != 0x1b))) {
        lVar5 = pNVar3[lVar5].children._M_elems[lVar10];
        if (lVar5 == -1) {
          return -1;
        }
        lVar7 = lVar7 + (state->letter_score)._M_elems[uVar1 + lVar9];
        lVar8 = lVar8 + 1;
        uVar2 = cursor + step * 2 + lVar9;
        if ((0xf0 < uVar2) || (lVar9 = lVar9 + step, (uVar2 & 0x800000000000000f) == 0xf)) break;
      }
    }
    else {
      lVar8 = 0;
    }
    lVar5 = pNVar3[lVar5].children._M_elems[0x1f];
    iVar6 = -1;
    if (lVar5 != -1) {
      lVar9 = lVar8;
      if ((ulong)(cursor - step) < 0xf1 && (cursor - step & 0x800000000000000fU) != 0xf) {
        lVar11 = cursor * 8 + step * -8;
        lVar10 = 0;
        do {
          lVar9 = lVar8;
          if ((*(long *)(board::word_multiplier + lVar11 + lVar10 * 8) == 0) ||
             (lVar4 = *(long *)((long)state + lVar10 * 8 + lVar11 + 8), lVar4 == 0x1b)) break;
          lVar5 = pNVar3[lVar5].children._M_elems[lVar4];
          if (lVar5 == -1) {
            return -1;
          }
          lVar7 = lVar7 + *(long *)((long)state + lVar10 * 8 + lVar11 + 0x808);
          uVar1 = cursor + step * -2 + lVar10;
          lVar9 = 1;
          if (0xf0 < uVar1) break;
          lVar8 = lVar8 + 1;
          lVar10 = lVar10 - step;
        } while ((uVar1 & 0x800000000000000f) != 0xf);
      }
      if (((lVar9 == 0) ||
          ((gaddag->node_to_word_).super__Vector_base<long,_std::allocator<long>_>._M_impl.
           super__Vector_impl_data._M_start[lVar5] != -1)) &&
         (iVar6 = lVar7 * *(long *)(board::word_multiplier + cursor * 8), lVar9 == 0)) {
        iVar6 = 0;
      }
    }
  }
  return iVar6;
}

Assistant:

idx orthogonal(idx step, idx cursor, const trie::Gaddag& gaddag,
               const board::State& state) {
    if (state.board[cursor + step] == emptiness &&
        state.board[cursor - step] == emptiness) {
        return 0;
    }
    const idx orig_cursor = cursor;
    idx score = state.letter_score[cursor] * board::letter_multiplier[cursor];

    chr node = gaddag.get(0, state.board[cursor]);
    cursor += step;
    idx depth = 0;
    while (!edge(cursor) && state.board[cursor] != emptiness) {
        score += state.letter_score[cursor];
        if (!gaddag.has(node, state.board[cursor])) return -1;
        node = gaddag.get(node, state.board[cursor]);
        cursor += step;
        ++depth;
    }
    if (!gaddag.has(node, trie::rev_marker)) return -1;
    node = gaddag.get(node, trie::rev_marker);
    step = -step;
    cursor = orig_cursor + step;
    while (!edge(cursor) && state.board[cursor] != emptiness) {
        score += state.letter_score[cursor];
        if (!gaddag.has(node, state.board[cursor])) return -1;
        node = gaddag.get(node, state.board[cursor]);
        cursor += step;
        ++depth;
    }
    if (depth > 0 && !gaddag.exists(node)) return -1;
    score *= board::word_multiplier[orig_cursor];
    if (depth == 0) score = 0;
    return score;
}